

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

int envy_bios_parse_hdtvtt(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_hdtvtt *peVar6;
  envy_bios_hdtvtt_entry *peVar7;
  envy_bios_hdtvtt_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_hdtvtt *hdtvtt;
  envy_bios *bios_local;
  
  peVar6 = &bios->hdtvtt;
  if (peVar6->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar2 = bios_u8(bios,(uint)peVar6->offset,&(bios->hdtvtt).version);
    iVar3 = bios_u8(bios,peVar6->offset + 1,&(bios->hdtvtt).hlen);
    iVar4 = bios_u8(bios,peVar6->offset + 2,&(bios->hdtvtt).entriesnum);
    iVar5 = bios_u8(bios,peVar6->offset + 3,&(bios->hdtvtt).rlen);
    if (iVar5 == 0 && (iVar4 == 0 && (iVar3 == 0 && iVar2 == 0))) {
      envy_bios_block(bios,(uint)peVar6->offset,
                      (uint)(bios->hdtvtt).hlen +
                      (uint)(bios->hdtvtt).rlen * (uint)(bios->hdtvtt).entriesnum,"HDTVTT",-1);
      uVar1 = (bios->hdtvtt).version;
      if (uVar1 == '\x10' || uVar1 == '\x11') {
        i = 4;
        if (9 < (bios->hdtvtt).hlen) {
          i = 10;
        }
        if ((uint)(bios->hdtvtt).hlen < (uint)i) {
          fprintf(_stderr,"HDTVTT table header too short [%d < %d]\n",(ulong)(bios->hdtvtt).hlen,
                  (ulong)(uint)i);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->hdtvtt).rlen < 2) {
          fprintf(_stderr,"HDTVTT table record too short [%d < %d]\n",(ulong)(bios->hdtvtt).rlen,2);
          bios_local._4_4_ = -0x16;
        }
        else {
          if ((uint)i < (uint)(bios->hdtvtt).hlen) {
            fprintf(_stderr,"HDTVTT table header longer than expected [%d > %d]\n",
                    (ulong)(bios->hdtvtt).hlen,(ulong)(uint)i);
          }
          if (2 < (bios->hdtvtt).rlen) {
            fprintf(_stderr,"HDTVTT table record longer than expected [%d > %d]\n",
                    (ulong)(bios->hdtvtt).rlen,2);
          }
          peVar7 = (envy_bios_hdtvtt_entry *)calloc((ulong)(bios->hdtvtt).entriesnum,2);
          (bios->hdtvtt).entries = peVar7;
          if ((bios->hdtvtt).entries == (envy_bios_hdtvtt_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->hdtvtt).entriesnum;
                entry._0_4_ = (int)entry + 1) {
              (bios->hdtvtt).entries[(int)entry].offset =
                   peVar6->offset + (ushort)(bios->hdtvtt).hlen +
                   (ushort)(bios->hdtvtt).rlen * (short)(int)entry;
            }
            (bios->hdtvtt).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown HDTVTT table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->hdtvtt).version >> 4),
                (ulong)((bios->hdtvtt).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_hdtvtt (struct envy_bios *bios) {
	struct envy_bios_hdtvtt *hdtvtt = &bios->hdtvtt;
	if (!hdtvtt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, hdtvtt->offset, &hdtvtt->version);
	err |= bios_u8(bios, hdtvtt->offset+1, &hdtvtt->hlen);
	err |= bios_u8(bios, hdtvtt->offset+2, &hdtvtt->entriesnum);
	err |= bios_u8(bios, hdtvtt->offset+3, &hdtvtt->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, hdtvtt->offset, hdtvtt->hlen + hdtvtt->rlen * hdtvtt->entriesnum, "HDTVTT", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (hdtvtt->version) {
		case 0x10:
		case 0x11:
			wanthlen = 4;
			if (hdtvtt->hlen >= 10)
				wanthlen = 10;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown HDTVTT table version %d.%d\n", hdtvtt->version >> 4, hdtvtt->version & 0xf);
			return -EINVAL;
	}
	if (hdtvtt->hlen < wanthlen) {
		ENVY_BIOS_ERR("HDTVTT table header too short [%d < %d]\n", hdtvtt->hlen, wanthlen);
		return -EINVAL;
	}
	if (hdtvtt->rlen < wantrlen) {
		ENVY_BIOS_ERR("HDTVTT table record too short [%d < %d]\n", hdtvtt->rlen, wantrlen);
		return -EINVAL;
	}
	if (hdtvtt->hlen > wanthlen) {
		ENVY_BIOS_WARN("HDTVTT table header longer than expected [%d > %d]\n", hdtvtt->hlen, wanthlen);
	}
	if (hdtvtt->rlen > wantrlen) {
		ENVY_BIOS_WARN("HDTVTT table record longer than expected [%d > %d]\n", hdtvtt->rlen, wantrlen);
	}
	hdtvtt->entries = calloc(hdtvtt->entriesnum, sizeof *hdtvtt->entries);
	if (!hdtvtt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < hdtvtt->entriesnum; i++) {
		struct envy_bios_hdtvtt_entry *entry = &hdtvtt->entries[i];
		entry->offset = hdtvtt->offset + hdtvtt->hlen + hdtvtt->rlen * i;
	}
	hdtvtt->valid = 1;
	return 0;
}